

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ucum.cpp
# Opt level: O0

void __thiscall UCUMConversions_convert1_Test::TestBody(UCUMConversions_convert1_Test *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  XMLElement *pXVar4;
  XMLAttribute *pXVar5;
  char *pcVar6;
  ostream *poVar7;
  char *in_R9;
  double val;
  precise_unit pVar8;
  AssertHelper local_490;
  Message local_488;
  int local_47c;
  undefined1 local_478 [8];
  AssertionResult gtest_ar_1;
  Message local_460;
  undefined1 local_458 [8];
  AssertionResult gtest_ar;
  AssertHelper local_428;
  Message local_420;
  bool local_411;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_;
  double act;
  undefined1 local_3d8 [8];
  precise_unit toUnit;
  undefined1 local_3a8 [8];
  precise_unit fromUnit;
  double outcome;
  double value;
  string local_380 [8];
  string unitToString;
  string local_358 [8];
  string unitFromString;
  XMLElement *pXStack_330;
  int failConvert;
  XMLElement *cs;
  undefined1 local_318 [8];
  XMLDocument doc;
  UCUMConversions_convert1_Test *this_local;
  
  doc._commentPool._120_8_ = this;
  tinyxml2::XMLDocument::XMLDocument((XMLDocument *)local_318,true,PRESERVE_WHITESPACE);
  tinyxml2::XMLDocument::LoadFile
            ((XMLDocument *)local_318,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/files/UcumFunctionalTests.xml"
            );
  pXVar4 = tinyxml2::XMLNode::FirstChildElement((XMLNode *)local_318,"ucumTests");
  pXVar4 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"conversion");
  pXStack_330 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"case");
  unitFromString.field_2._12_4_ = 0;
  while (pXStack_330 != (XMLElement *)0x0) {
    pXVar5 = tinyxml2::XMLElement::FindAttribute(pXStack_330,"srcUnit");
    pcVar6 = tinyxml2::XMLAttribute::Value(pXVar5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_358,pcVar6,(allocator *)(unitToString.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(unitToString.field_2._M_local_buf + 0xf));
    pXVar5 = tinyxml2::XMLElement::FindAttribute(pXStack_330,"dstUnit");
    pcVar6 = tinyxml2::XMLAttribute::Value(pXVar5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_380,pcVar6,(allocator *)((long)&value + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&value + 7));
    pXVar5 = tinyxml2::XMLElement::FindAttribute(pXStack_330,"value");
    val = tinyxml2::XMLAttribute::DoubleValue(pXVar5);
    pXVar5 = tinyxml2::XMLElement::FindAttribute(pXStack_330,"outcome");
    fromUnit._8_8_ = tinyxml2::XMLAttribute::DoubleValue(pXVar5);
    std::__cxx11::string::string((string *)&toUnit.base_units_,local_358);
    pVar8 = units::unit_from_string((string *)&toUnit.base_units_,7);
    fromUnit.multiplier_ = pVar8._8_8_;
    local_3a8 = (undefined1  [8])pVar8.multiplier_;
    std::__cxx11::string::~string((string *)&toUnit.base_units_);
    std::__cxx11::string::string((string *)&act,local_380);
    pVar8 = units::unit_from_string((string *)&act,7);
    toUnit.multiplier_ = pVar8._8_8_;
    local_3d8 = (undefined1  [8])pVar8.multiplier_;
    std::__cxx11::string::~string((string *)&act);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )units::convert<units::precise_unit,units::precise_unit>
                     (val,(precise_unit *)local_3a8,(precise_unit *)local_3d8);
    iVar2 = std::isnan((double)gtest_ar_.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl);
    local_411 = (bool)(~(byte)iVar2 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_410,&local_411,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
    if (!bVar1) {
      testing::Message::Message(&local_420);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar.message_,(internal *)local_410,
                 (AssertionResult *)"std::isnan(act)","true","false",in_R9);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_428,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_ucum.cpp"
                 ,0x27b,pcVar6);
      testing::internal::AssertHelper::operator=(&local_428,&local_420);
      testing::internal::AssertHelper::~AssertHelper(&local_428);
      std::__cxx11::string::~string((string *)&gtest_ar.message_);
      testing::Message::~Message(&local_420);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
    uVar3 = std::isnan((double)gtest_ar_.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl);
    if ((uVar3 & 1) == 0) {
      testing::internal::DoubleNearPredFormat
                ((internal *)local_458,"outcome","act","0.001 * outcome",(double)fromUnit._8_8_,
                 (double)gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl,(double)fromUnit._8_8_ * 0.001);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
      if (!bVar1) {
        testing::Message::Message(&local_460);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_458);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_ucum.cpp"
                   ,0x27d,pcVar6);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_460);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_460);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
      if (0.001 < ABS((double)fromUnit._8_8_ -
                      (double)gtest_ar_.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl) / (double)fromUnit._8_8_) {
        poVar7 = std::operator<<((ostream *)&std::cout,local_358);
        poVar7 = std::operator<<(poVar7," and ");
        poVar7 = std::operator<<(poVar7,local_380);
        poVar7 = std::operator<<(poVar7," do not convert ");
        poVar7 = (ostream *)
                 std::ostream::operator<<
                           (poVar7,(double)gtest_ar_.message_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl);
        poVar7 = std::operator<<(poVar7," and expected=");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,(double)fromUnit._8_8_);
        std::operator<<(poVar7,'\n');
      }
    }
    pXStack_330 = tinyxml2::XMLNode::NextSiblingElement(&pXStack_330->super_XMLNode,"case");
    std::__cxx11::string::~string(local_380);
    std::__cxx11::string::~string(local_358);
  }
  local_47c = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_478,"failConvert","0",
             (int *)(unitFromString.field_2._M_local_buf + 0xc),&local_47c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
  if (!bVar1) {
    testing::Message::Message(&local_488);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_478);
    testing::internal::AssertHelper::AssertHelper
              (&local_490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_ucum.cpp",
               0x287,pcVar6);
    testing::internal::AssertHelper::operator=(&local_490,&local_488);
    testing::internal::AssertHelper::~AssertHelper(&local_490);
    testing::Message::~Message(&local_488);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  tinyxml2::XMLDocument::~XMLDocument((XMLDocument *)local_318);
  return;
}

Assistant:

TEST(UCUMConversions, convert1)
{
    tinyxml2::XMLDocument doc;
    doc.LoadFile(TEST_FILE_FOLDER "/UcumFunctionalTests.xml");

    auto cs = doc.FirstChildElement("ucumTests")
                  ->FirstChildElement("conversion")
                  ->FirstChildElement("case");
    int failConvert = 0;
    while (cs != nullptr) {
        std::string unitFromString = cs->FindAttribute("srcUnit")->Value();
        std::string unitToString = cs->FindAttribute("dstUnit")->Value();
        double value = cs->FindAttribute("value")->DoubleValue();
        double outcome = cs->FindAttribute("outcome")->DoubleValue();
        // std::string id = cs->FindAttribute("id")->Value();
        auto fromUnit =
            units::unit_from_string(unitFromString, units::strict_ucum);
        auto toUnit = units::unit_from_string(unitToString, units::strict_ucum);

        double act = units::convert(value, fromUnit, toUnit);
        EXPECT_FALSE(std::isnan(act));
        if (!std::isnan(act)) {
            EXPECT_NEAR(outcome, act, 0.001 * outcome);
            if (std::fabs(outcome - act) / outcome > 0.001) {
                std::cout << unitFromString << " and " << unitToString
                          << " do not convert " << act
                          << " and expected=" << outcome << '\n';
            }
        }

        cs = cs->NextSiblingElement("case");
    }
    EXPECT_EQ(failConvert, 0);
}